

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSMisc.c
# Opt level: O0

void free_array2(void **p,int height)

{
  int local_18;
  int i;
  int height_local;
  void **p_local;
  
  if (p != (void **)0x0) {
    for (local_18 = 0; local_18 < height; local_18 = local_18 + 1) {
      free(p[local_18]);
      p[local_18] = (void *)0x0;
    }
    free(p);
  }
  return;
}

Assistant:

void free_array2(void** p, int height)	
{
	int i = 0;

	if (p == NULL)	
	{
		return;
	}

	for (i = 0; i < height; i++)	
	{
		free(p[i]); p[i] = NULL;
	}
	free(p); p = NULL;
}